

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O3

void lts2::ImageWaveletScale(Mat *src,Mat *dest,double *P,double *Q,int fsize,int scale,int *rscale)

{
  float fVar1;
  long lVar2;
  double *pdVar3;
  _InputArray *p_Var4;
  ulong uVar5;
  undefined8 uVar6;
  double dVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  pointer pMVar12;
  pointer pMVar13;
  uint n;
  uint uVar14;
  double *pdVar15;
  pointer pMVar16;
  ulong uVar17;
  uint n_00;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  vector<cv::Mat,_std::allocator<cv::Mat>_> dest_components;
  Mat ret;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_428;
  uint local_404;
  double *local_400;
  double *local_3f8;
  ulong local_3f0;
  Mat *local_3e8;
  double local_3e0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_3d8;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Mat *local_3a8;
  Mat *local_3a0;
  Mat *local_398;
  undefined8 local_390;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  double local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined1 local_350 [16];
  Size local_340;
  Mat local_2e0 [96];
  Mat aMStack_280 [144];
  Mat local_1f0 [96];
  undefined1 local_190 [16];
  Size local_180;
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  uVar20 = (ulong)(uint)fsize;
  cv::Mat::Mat(local_1f0);
  local_3b8 = **(undefined8 **)(src + 0x40);
  uStack_3b0 = 0;
  local_190._8_8_ = &local_428;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = 0x1010000;
  local_180.width = 0;
  local_180.height = 0;
  local_190._0_4_ = 0x2050000;
  local_3e8 = src;
  local_350._8_8_ = src;
  cv::split((_InputArray *)local_350,(_OutputArray *)local_190);
  pMVar12 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar13 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar2 = (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  uVar18 = -(ulong)((ulong)(lVar2 * -0x5555555555555555) >> 0x3d != 0) | lVar2 * 0x5555555555555558;
  local_3f8 = (double *)operator_new__(uVar18);
  local_3a8 = dest;
  pdVar3 = (double *)operator_new__(uVar18);
  pMVar16 = pMVar13;
  local_400 = pdVar3;
  if (pMVar13 != pMVar12) {
    dVar7 = 0.0;
    uVar18 = 0;
    pdVar15 = local_3f8;
    do {
      local_350._8_8_ = pMVar12 + (long)dVar7;
      local_340.width = 0;
      local_340.height = 0;
      local_350._0_4_ = 0x1010000;
      local_3e0 = dVar7;
      p_Var4 = (_InputArray *)cv::noArray();
      cv::minMaxLoc((_InputArray *)local_350,pdVar15,pdVar3,(Point_ *)0x0,(Point_ *)0x0,p_Var4);
      uVar18 = uVar18 + 1;
      uVar5 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      dVar7 = (double)((long)local_3e0 + 0x60);
      pdVar3 = pdVar3 + 1;
      pdVar15 = pdVar15 + 1;
      pMVar13 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar12 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar16 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar18 <= uVar5 && uVar5 - uVar18 != 0);
  }
  uVar11 = *(uint *)(local_3e8 + 8);
  n_00 = *(uint *)(local_3e8 + 0xc);
  local_3f0 = 0;
  if ((uVar11 & 1) == 0 &&
      (((n_00 & 1) == 0 && 0 < scale) && (fsize <= (int)uVar11 && fsize <= (int)n_00))) {
    uVar5 = 1;
    n = uVar11;
    do {
      bVar21 = pMVar16 != pMVar13;
      pMVar16 = pMVar13;
      local_3f0 = uVar5;
      if (bVar21) {
        uVar18 = 0;
        do {
          if (0 < (int)n) {
            uVar11 = 0;
            do {
              uVar5 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar5 < uVar18 || uVar5 - uVar18 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar18);
                goto LAB_00110eda;
              }
              Wavegeneral_h(local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar18 * 0x60,uVar11,n_00,0,P,Q,fsize
                           );
              uVar11 = uVar11 + 1;
            } while (n != uVar11);
          }
          if (0 < (int)n_00) {
            uVar11 = 0;
            do {
              uVar5 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                             .super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar5 < uVar18 || uVar5 - uVar18 == 0) goto LAB_00110eda;
              Wavegeneral_v(local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar18 * 0x60,uVar11,n,0,P,Q,fsize);
              uVar11 = uVar11 + 1;
            } while (n_00 != uVar11);
          }
          uVar18 = uVar18 + 1;
          uVar5 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          pMVar13 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pMVar16 = local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar18 <= uVar5 && uVar5 - uVar18 != 0);
      }
      uVar19 = (int)n_00 >> 1;
      uVar18 = (ulong)uVar19;
      uVar11 = (int)n >> 1;
    } while (((((int)local_3f0 < scale) && (fsize <= (int)uVar19)) && (fsize <= (int)uVar11)) &&
            (((n_00 & 2) == 0 &&
             (uVar5 = (ulong)((int)local_3f0 + 1), uVar14 = n & 2, n = uVar11, n_00 = uVar19,
             uVar14 == 0))));
  }
  else {
    uVar18 = (ulong)n_00;
  }
  local_404 = uVar11;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            (&local_3d8,((long)pMVar16 - (long)pMVar13 >> 5) * -0x5555555555555555);
  if (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a0 = aMStack_280;
    local_398 = aMStack_c0;
    uVar5 = (ulong)local_404;
    local_388 = local_3b8._4_4_;
    uStack_384 = (float)local_3b8;
    uStack_380 = (undefined4)uStack_3b0;
    uStack_37c = local_3b8._4_4_;
    uVar20 = 0;
    do {
      uVar10 = ((long)local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      if (uVar10 < uVar20 || uVar10 - uVar20 == 0) goto LAB_00110f0d;
      lVar2 = uVar20 * 0x60;
      fVar23 = **(float **)
                 (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar2 + 0x10);
      local_390 = CONCAT44(uStack_384,local_388);
      cv::Mat::create(local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar2,&local_390,5);
      uVar10 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      fVar22 = fVar23;
      if (0 < (int)local_404) {
        uVar8 = 0;
        do {
          if (0 < (int)uVar18) {
            if (uVar10 < uVar20 || uVar10 - uVar20 == 0) goto LAB_00110eeb;
            uVar17 = 0;
            do {
              fVar1 = *(float *)(**(long **)(local_428.
                                             super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar2 + 0x48
                                            ) * uVar8 +
                                 *(long *)(local_428.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar2 + 0x10)
                                + uVar17 * 4);
              if (fVar1 <= fVar23) {
                fVar23 = fVar1;
              }
              if (fVar22 <= fVar1) {
                fVar22 = fVar1;
              }
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar5);
      }
      if (uVar10 < uVar20 || uVar10 - uVar20 == 0) goto LAB_00110efc;
      local_3e0 = local_3f8[uVar20];
      dVar7 = local_400[uVar20] - local_3e0;
      local_3e8 = (Mat *)(double)(fVar22 - fVar23);
      local_3b8 = CONCAT44(local_3b8._4_4_,fVar23);
      cv::operator*((double)(float)(dVar7 / (double)local_3e8),(Mat *)local_190);
      local_370 = (double)(float)(local_3e0 - (dVar7 * (double)(float)local_3b8) / (double)local_3e8
                                 );
      local_368 = 0;
      uStack_360 = 0;
      local_358 = 0;
      cv::operator+((MatExpr *)local_350,(Scalar_ *)local_190);
      uVar10 = ((long)local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      if (uVar10 < uVar20 || uVar10 - uVar20 == 0) goto LAB_00110f1e;
      (**(code **)(*(long *)CONCAT44(local_350._4_4_,local_350._0_4_) + 0x18))
                ((long *)CONCAT44(local_350._4_4_,local_350._0_4_),local_350,
                 local_3d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar2,0xffffffff);
      cv::Mat::~Mat(local_3a0);
      cv::Mat::~Mat(local_2e0);
      cv::Mat::~Mat((Mat *)(local_350 + 0x10));
      cv::Mat::~Mat(local_398);
      cv::Mat::~Mat(local_120);
      cv::Mat::~Mat((Mat *)(local_190 + 0x10));
      uVar20 = uVar20 + 1;
      uVar10 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    } while (uVar20 <= uVar10 && uVar10 - uVar20 != 0);
  }
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = 0x1050000;
  local_350._8_8_ = &local_3d8;
  local_180.width = 0;
  local_180.height = 0;
  local_190._0_4_ = 0x2010000;
  local_190._8_8_ = local_3a8;
  cv::merge((_InputArray *)local_350,(_OutputArray *)local_190);
  iVar9 = (int)local_3f0;
  if (scale == 0) {
    iVar9 = 0;
  }
  *rscale = iVar9;
  operator_delete__(local_3f8);
  operator_delete__(local_400);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3d8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_428);
  cv::Mat::~Mat(local_1f0);
  return;
LAB_00110eda:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18);
LAB_00110eeb:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
LAB_00110efc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
LAB_00110f0d:
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar20);
LAB_00110f1e:
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar20,uVar10);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3d8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_428);
  cv::Mat::~Mat(local_1f0);
  _Unwind_Resume(uVar6);
}

Assistant:

void lts2::ImageWaveletScale(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int scale, int *rscale)
{
  cv::Mat ret;
  float *min, *max, a, c;
	
  cv::Size imageSize = src.size();
        
  std::vector<cv::Mat> components, dest_components;
  cv::split(src, components);
    
  double *omin = new double[components.size()];
  double *omax = new double[components.size()];
    
  for (int b = 0; b < components.size(); ++b)
    cv::minMaxLoc(components.at(b), &omin[b], &omax[b]);
	
  int width = src.cols;
  int height = src.rows;
  int num = 1;
	
  while(num<=scale && width>=fsize && height>=fsize && !(width%2) && !(height%2)) 
  {
    for (int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
    width /= 2; 
    height /= 2;
    ++num;
  }
    
  dest_components.reserve(components.size());
    	
  min = new float[components.size()];
  max = new float[components.size()];
    
  for (int b = 0; b < components.size(); ++b) 
  {
    min[b] = max[b] = components.at(b).at<float>(0, 0);
    dest_components.at(b).create(imageSize, CV_32FC1);
        
    for(int j = 0; j < height; ++j) 
    {
      for(int i = 0; i < width; ++i) 
      {
        min[b] = MIN(components.at(b).at<float>(j, i), min[b]);
        max[b] = MAX(components.at(b).at<float>(j, i), max[b]);
      }
    }
    a = (omax[b] - omin[b]) / (max[b] - min[b]);
    c = omin[b] - min[b]*(omax[b] - omin[b]) / (max[b] - min[b]);
        
    dest_components.at(b) = a * components.at(b) + c;
  }
    
  cv::merge(dest_components, dest);
    
  if (scale != 0) 
    *rscale = num - 1;
  else 
    *rscale = 0;
    
  delete[] min;
  delete[] max;
  delete[] omin;
  delete[] omax;
	
  return;
}